

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example_Any_parse_json_union
                 (flatcc_json_parser_t *ctx,char *buf,char *end,uint8_t type,
                 flatcc_builder_ref_t *result)

{
  char *pcVar1;
  flatcc_builder_ref_t *result_local;
  uint8_t type_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  *result = 0;
  switch(type) {
  case '\0':
    pcVar1 = flatcc_json_parser_none(ctx,buf,end);
    return pcVar1;
  case '\x01':
    end_local = MyGame_Example_Monster_parse_json_table(ctx,buf,end,result);
    break;
  case '\x02':
    end_local = MyGame_Example_TestSimpleTableWithEnum_parse_json_table(ctx,buf,end,result);
    break;
  case '\x03':
    end_local = MyGame_Example2_Monster_parse_json_table(ctx,buf,end,result);
    break;
  case '\x04':
    end_local = MyGame_Example_Alt_parse_json_table(ctx,buf,end,result);
    break;
  default:
    if ((ctx->flags & 1) == 0) {
      pcVar1 = flatcc_json_parser_set_error(ctx,buf,end,0xf);
      return pcVar1;
    }
    pcVar1 = flatcc_json_parser_generic_json(ctx,buf,end);
    return pcVar1;
  }
  if (ctx->error == 0) {
    if (*result == 0) {
      ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,end_local,end,0x23);
    }
    else {
      ctx_local = (flatcc_json_parser_t *)end_local;
    }
  }
  else {
    ctx_local = (flatcc_json_parser_t *)end_local;
  }
  return (char *)ctx_local;
}

Assistant:

static const char *MyGame_Example_Any_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *result)
{

    *result = 0;
    switch (type) {
    case 0: /* NONE */
        return flatcc_json_parser_none(ctx, buf, end);
    case 1: /* Monster */
        buf = MyGame_Example_Monster_parse_json_table(ctx, buf, end, result);
        break;
    case 2: /* TestSimpleTableWithEnum */
        buf = MyGame_Example_TestSimpleTableWithEnum_parse_json_table(ctx, buf, end, result);
        break;
    case 3: /* Monster2 */
        buf = MyGame_Example2_Monster_parse_json_table(ctx, buf, end, result);
        break;
    case 4: /* Alt */
        buf = MyGame_Example_Alt_parse_json_table(ctx, buf, end, result);
        break;
    default:
        if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);
        } else {
            return flatcc_json_parser_generic_json(ctx, buf, end);
        }
    }
    if (ctx->error) return buf;
    if (!*result) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
    }
    return buf;
}